

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall higan::EventLoop::HandleActiveEvent(EventLoop *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  
  this->handling_pending_event_ = true;
  ppCVar1 = (this->active_channel_list_).
            super__Vector_base<higan::Channel_*,_std::allocator<higan::Channel_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->active_channel_list_).
                 super__Vector_base<higan::Channel_*,_std::allocator<higan::Channel_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
    Channel::HandleEvent(*ppCVar2);
  }
  this->handling_pending_event_ = false;
  return;
}

Assistant:

void EventLoop::HandleActiveEvent()
{
	handling_pending_event_ = true;
	for (Channel* channel : active_channel_list_)
	{
		channel->HandleEvent();
	}
	handling_pending_event_ = false;
}